

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::MatchLiteralInst::Exec
          (MatchLiteralInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  ulong uVar1;
  Char *pCVar2;
  Char *pCVar3;
  uint uVar4;
  Type pRVar5;
  long lVar6;
  code *pcVar7;
  bool bVar8;
  undefined4 *puVar9;
  ulong uVar10;
  uint uVar11;
  CharCount CVar12;
  Char *pCVar13;
  
  uVar11 = (this->super_LiteralMixin).length;
  if ((((matcher->program).ptr)->rep).insts.litbufLen - (this->super_LiteralMixin).offset < uVar11)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x64c,"(length <= matcher.program->rep.insts.litbufLen - offset)",
                       "length <= matcher.program->rep.insts.litbufLen - offset");
    if (!bVar8) {
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar9 = 0;
    uVar11 = (this->super_LiteralMixin).length;
  }
  uVar4 = *inputOffset;
  if (uVar11 <= inputLength - uVar4) {
    pRVar5 = matcher->stats;
    lVar6 = *(long *)((long)&((matcher->program).ptr)->rep + 0x10);
    uVar10 = (ulong)(this->super_LiteralMixin).offset;
    pCVar2 = (Char *)(lVar6 + uVar10 * 2);
    if (pRVar5 != (Type)0x0) {
      pRVar5->numCompares = pRVar5->numCompares + 1;
    }
    if (*pCVar2 == input[uVar4]) {
      pCVar13 = (Char *)(lVar6 + uVar10 * 2);
      uVar10 = (ulong)uVar4 * 2 + 2;
      do {
        pCVar13 = pCVar13 + 1;
        if (pCVar2 + uVar11 <= pCVar13) {
          *inputOffset = (CharCount)(uVar10 >> 1);
          *instPointer = *instPointer + 9;
          return false;
        }
        if (pRVar5 != (Type)0x0) {
          pRVar5->numCompares = pRVar5->numCompares + 1;
        }
        uVar1 = uVar10 + 2;
        pCVar3 = (Char *)((long)input + uVar10);
        uVar10 = uVar1;
      } while (*pCVar13 == *pCVar3);
      CVar12 = (CharCount)(uVar1 >> 1);
    }
    else {
      CVar12 = uVar4 + 1;
    }
    *inputOffset = CVar12;
  }
  bVar8 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  return bVar8;
}

Assistant:

inline bool MatchLiteralInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(length <= matcher.program->rep.insts.litbufLen - offset);

        if (length > inputLength - inputOffset)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalBuffer = matcher.program->rep.insts.litbuf;
        const Char * literalCurr = literalBuffer + offset;
        const Char * inputCurr = input + inputOffset;

#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (*literalCurr != *inputCurr)
        {
            inputOffset++;
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalEnd = literalCurr + length;
        literalCurr++;
        inputCurr++;

        while (literalCurr < literalEnd)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            if (*literalCurr != *inputCurr++)
            {
                inputOffset = (CharCount)(inputCurr - input);
                return matcher.Fail(FAIL_PARAMETERS);
            }
            literalCurr++;
        }

        inputOffset = (CharCount)(inputCurr - input);
        instPointer += sizeof(*this);
        return false;
    }